

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O2

c_float * vec_copy(c_float *a,c_int n)

{
  c_float *pcVar1;
  long lVar2;
  
  pcVar1 = (c_float *)malloc(n * 8);
  if (pcVar1 != (c_float *)0x0) {
    lVar2 = 0;
    if (n < 1) {
      n = lVar2;
    }
    for (; n != lVar2; lVar2 = lVar2 + 1) {
      pcVar1[lVar2] = a[lVar2];
    }
  }
  return pcVar1;
}

Assistant:

c_float* vec_copy(c_float *a, c_int n) {
  c_float *b;
  c_int    i;

  b = c_malloc(n * sizeof(c_float));
  if (!b) return OSQP_NULL;

  for (i = 0; i < n; i++) {
    b[i] = a[i];
  }

  return b;
}